

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcast_unsigned_converters.hpp
# Opt level: O0

bool __thiscall
boost::detail::lcast_ret_unsigned<std::char_traits<char>,_unsigned_int,_char>::
main_convert_iteration(lcast_ret_unsigned<std::char_traits<char>,_unsigned_int,_char> *this)

{
  uint uVar1;
  int iVar2;
  bool local_21;
  uint new_sub_value;
  uint dig_value;
  uint maxv;
  char czero;
  lcast_ret_unsigned<std::char_traits<char>,_unsigned_int,_char> *this_local;
  bool local_1;
  
  local_21 = true;
  if ((this->m_multiplier_overflowed & 1U) == 0) {
    local_21 = 0x19999999 < this->m_multiplier;
  }
  this->m_multiplier_overflowed = local_21;
  this->m_multiplier = this->m_multiplier * 10;
  uVar1 = (int)*this->m_end - 0x30;
  iVar2 = this->m_multiplier * uVar1;
  if (((*this->m_end < '0') || ('9' < *this->m_end)) ||
     ((uVar1 != 0 &&
      ((((this->m_multiplier_overflowed & 1U) != 0 ||
        ((uint)(0xffffffff / (ulong)uVar1) < this->m_multiplier)) || (-iVar2 - 1U < *this->m_value))
      )))) {
    local_1 = false;
  }
  else {
    *this->m_value = *this->m_value + iVar2;
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool main_convert_iteration() BOOST_NOEXCEPT {
                CharT const czero = lcast_char_constants<CharT>::zero;
                T const maxv = (std::numeric_limits<T>::max)();

                m_multiplier_overflowed = m_multiplier_overflowed || (maxv/10 < m_multiplier);
                m_multiplier = static_cast<T>(m_multiplier * 10);

                T const dig_value = static_cast<T>(*m_end - czero);
                T const new_sub_value = static_cast<T>(m_multiplier * dig_value);

                // We must correctly handle situations like `000000000000000000000000000001`.
                // So we take care of overflow only if `dig_value` is not '0'.
                if (*m_end < czero || *m_end >= czero + 10  // checking for correct digit
                    || (dig_value && (                      // checking for overflow of ... 
                        m_multiplier_overflowed                             // ... multiplier
                        || static_cast<T>(maxv / dig_value) < m_multiplier  // ... subvalue
                        || static_cast<T>(maxv - new_sub_value) < m_value   // ... whole expression
                    ))
                ) return false;

                m_value = static_cast<T>(m_value + new_sub_value);
                
                return true;
            }